

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O0

xmlOutputBufferPtr xmlAllocOutputBufferInternal(xmlCharEncodingHandlerPtr encoder)

{
  xmlBufPtr pxVar1;
  xmlOutputBufferPtr ret;
  xmlCharEncodingHandlerPtr encoder_local;
  
  encoder_local = (xmlCharEncodingHandlerPtr)(*xmlMalloc)(0x38);
  if ((xmlOutputBufferPtr)encoder_local == (xmlOutputBufferPtr)0x0) {
    xmlIOErrMemory("creating output buffer");
    encoder_local = (xmlCharEncodingHandlerPtr)0x0;
  }
  else {
    memset(encoder_local,0,0x38);
    pxVar1 = xmlBufCreate();
    ((xmlOutputBufferPtr)encoder_local)->buffer = pxVar1;
    if (((xmlOutputBufferPtr)encoder_local)->buffer == (xmlBufPtr)0x0) {
      (*xmlFree)(encoder_local);
      encoder_local = (xmlCharEncodingHandlerPtr)0x0;
    }
    else {
      xmlBufSetAllocationScheme(((xmlOutputBufferPtr)encoder_local)->buffer,XML_BUFFER_ALLOC_IO);
      ((xmlOutputBufferPtr)encoder_local)->encoder = encoder;
      if (encoder == (xmlCharEncodingHandlerPtr)0x0) {
        ((xmlOutputBufferPtr)encoder_local)->conv = (xmlBufPtr)0x0;
      }
      else {
        pxVar1 = xmlBufCreateSize(4000);
        ((xmlOutputBufferPtr)encoder_local)->conv = pxVar1;
        if (((xmlOutputBufferPtr)encoder_local)->conv == (xmlBufPtr)0x0) {
          xmlBufFree(((xmlOutputBufferPtr)encoder_local)->buffer);
          (*xmlFree)(encoder_local);
          return (xmlOutputBufferPtr)0x0;
        }
        xmlCharEncOutput((xmlOutputBufferPtr)encoder_local,1);
      }
      ((xmlOutputBufferPtr)encoder_local)->writecallback = (xmlOutputWriteCallback)0x0;
      ((xmlOutputBufferPtr)encoder_local)->closecallback = (xmlOutputCloseCallback)0x0;
      ((xmlOutputBufferPtr)encoder_local)->context = (void *)0x0;
      ((xmlOutputBufferPtr)encoder_local)->written = 0;
    }
  }
  return (xmlOutputBufferPtr)encoder_local;
}

Assistant:

xmlOutputBufferPtr
xmlAllocOutputBufferInternal(xmlCharEncodingHandlerPtr encoder) {
    xmlOutputBufferPtr ret;

    ret = (xmlOutputBufferPtr) xmlMalloc(sizeof(xmlOutputBuffer));
    if (ret == NULL) {
	xmlIOErrMemory("creating output buffer");
	return(NULL);
    }
    memset(ret, 0, sizeof(xmlOutputBuffer));
    ret->buffer = xmlBufCreate();
    if (ret->buffer == NULL) {
        xmlFree(ret);
	return(NULL);
    }


    /*
     * For conversion buffers we use the special IO handling
     */
    xmlBufSetAllocationScheme(ret->buffer, XML_BUFFER_ALLOC_IO);

    ret->encoder = encoder;
    if (encoder != NULL) {
        ret->conv = xmlBufCreateSize(4000);
	if (ret->conv == NULL) {
            xmlBufFree(ret->buffer);
	    xmlFree(ret);
	    return(NULL);
	}

	/*
	 * This call is designed to initiate the encoder state
	 */
        xmlCharEncOutput(ret, 1);
    } else
        ret->conv = NULL;
    ret->writecallback = NULL;
    ret->closecallback = NULL;
    ret->context = NULL;
    ret->written = 0;

    return(ret);
}